

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  int *piVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  PrimRef *pPVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  ulong uVar13;
  int iVar14;
  size_t sVar15;
  int iVar16;
  size_t sVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  uint *puVar20;
  long lVar21;
  ulong uVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar23;
  long lVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  float fVar26;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  ulong local_12b0;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined8 local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [2976];
  undefined1 auStack_690 [16];
  uint local_680 [2];
  undefined8 local_678 [61];
  undefined1 auStack_490 [32];
  undefined1 auStack_470 [480];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  lVar12 = 0xc00;
  pauVar19 = (undefined1 (*) [16])local_1230;
  auVar32._8_4_ = 0x7f800000;
  auVar32._0_8_ = 0x7f8000007f800000;
  auVar32._12_4_ = 0x7f800000;
  auVar36._8_4_ = 0xff800000;
  auVar36._0_8_ = 0xff800000ff800000;
  auVar36._12_4_ = 0xff800000;
  do {
    pauVar19[-1] = auVar32;
    *pauVar19 = auVar36;
    pauVar19[-3] = auVar32;
    pauVar19[-2] = auVar36;
    pauVar19[-5] = auVar32;
    pauVar19[-4] = auVar36;
    *(undefined8 *)((long)local_1280 + lVar12) = 0;
    *(undefined8 *)((long)local_1280 + lVar12 + 8) = 0;
    lVar12 = lVar12 + 0x10;
    pauVar19 = pauVar19 + 6;
  } while (lVar12 != 0xe00);
  uVar7 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar26 = (float)(uVar8 - uVar7) * 0.05 + 4.0;
  uVar13 = (ulong)fVar26;
  uVar13 = (long)(fVar26 - 9.223372e+18) & (long)uVar13 >> 0x3f | uVar13;
  local_12b0 = 0x20;
  if (uVar13 < 0x20) {
    local_12b0 = uVar13;
  }
  local_12a0 = *(undefined1 (*) [16])(set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128;
  auVar41 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       local_12a0);
  auVar39._8_4_ = 0x704ec3d;
  auVar39._0_8_ = 0x704ec3d0704ec3d;
  auVar39._12_4_ = 0x704ec3d;
  auVar44 = vmaxps_avx(auVar39,auVar41);
  auVar41 = vcmpps_avx(auVar44,auVar39,6);
  auVar39 = vshufps_avx(ZEXT416((uint)((float)(long)local_12b0 * 0.99)),
                        ZEXT416((uint)((float)(long)local_12b0 * 0.99)),0);
  auVar44 = vdivps_avx(auVar39,auVar44);
  local_1290 = vandps_avx(auVar41,auVar44);
  uVar22 = uVar8 - uVar7;
  if (uVar22 != 0) {
    pPVar9 = this->prims0;
    fVar26 = local_1290._0_4_;
    fVar29 = local_1290._4_4_;
    fVar30 = local_1290._8_4_;
    fVar31 = local_1290._12_4_;
    if (uVar22 == 1) {
      uVar18 = 0;
    }
    else {
      auVar41 = vpshufd_avx(ZEXT416((int)local_12b0 - 1),0);
      paVar23 = &pPVar9[uVar7 + 1].upper.field_0;
      uVar18 = 0;
      do {
        aVar3 = paVar23[-3].field_1;
        aVar4 = paVar23[-2].field_1;
        auVar44._0_4_ = aVar3.x + aVar4.x;
        auVar44._4_4_ = aVar3.y + aVar4.y;
        auVar44._8_4_ = aVar3.z + aVar4.z;
        auVar44._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
        aVar5 = paVar23[-1].field_1;
        auVar44 = vsubps_avx(auVar44,local_12a0);
        auVar45._0_4_ = fVar26 * auVar44._0_4_;
        auVar45._4_4_ = fVar29 * auVar44._4_4_;
        auVar45._8_4_ = fVar30 * auVar44._8_4_;
        auVar45._12_4_ = fVar31 * auVar44._12_4_;
        auVar44 = vroundps_avx(auVar45,1);
        aVar6 = paVar23->field_1;
        auVar44 = vcvtps2dq_avx(auVar44);
        auVar44 = vpminsd_avx(auVar44,auVar41);
        auVar45 = vpmaxsd_avx(auVar44,ZEXT816(0) << 0x20);
        auVar46._0_4_ = aVar5.x + aVar6.x;
        auVar46._4_4_ = aVar5.y + aVar6.y;
        auVar46._8_4_ = aVar5.z + aVar6.z;
        auVar46._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
        auVar44 = vsubps_avx(auVar46,local_12a0);
        auVar47._0_4_ = auVar44._0_4_ * fVar26;
        auVar47._4_4_ = auVar44._4_4_ * fVar29;
        auVar47._8_4_ = auVar44._8_4_ * fVar30;
        auVar47._12_4_ = auVar44._12_4_ * fVar31;
        auVar44 = vroundps_avx(auVar47,1);
        auVar44 = vcvtps2dq_avx(auVar44);
        auVar44 = vpminsd_avx(auVar44,auVar41);
        lVar12 = CONCAT44((int)((ulong)set >> 0x20),auVar45._0_4_);
        auVar46 = vpmaxsd_avx(auVar44,ZEXT816(0) << 0x20);
        auVar39 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar12 * 0xc),
                             (undefined1  [16])aVar3);
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1270 + lVar12 * 0x60),
                             (undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1280 + lVar12 * 0xc) = auVar39;
        *(undefined1 (*) [16])(local_1270 + lVar12 * 0x60) = auVar44;
        lVar21 = (ulong)auVar45._4_4_ * 0x60;
        auVar39 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar21),(undefined1  [16])aVar3);
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar21),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1260 + lVar21) = auVar39;
        *(undefined1 (*) [16])(local_1250 + lVar21) = auVar44;
        lVar21 = (ulong)auVar45._8_4_ * 0x60;
        auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar21),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_1240 + lVar21) = auVar44;
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar21),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1230 + lVar21) = auVar44;
        puVar20 = local_680 + lVar12 * 4;
        *puVar20 = *puVar20 + 1;
        piVar1 = (int *)((long)local_678 + (ulong)auVar45._4_4_ * 0x10 + -4);
        *piVar1 = *piVar1 + 1;
        lVar12 = CONCAT44((int)((ulong)(lVar12 * 0x10) >> 0x20),auVar46._0_4_);
        *(int *)(local_678 + (ulong)auVar45._8_4_ * 2) =
             *(int *)(local_678 + (ulong)auVar45._8_4_ * 2) + 1;
        auVar44 = *(undefined1 (*) [16])(local_1270 + lVar12 * 0x60);
        auVar39 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar12 * 0xc),
                             (undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1280 + lVar12 * 0xc) = auVar39;
        auVar44 = vmaxps_avx(auVar44,(undefined1  [16])aVar6);
        lVar21 = (ulong)auVar46._4_4_ * 0x60;
        *(undefined1 (*) [16])(local_1270 + lVar12 * 0x60) = auVar44;
        auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar21),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1260 + lVar21) = auVar44;
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar21),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1250 + lVar21) = auVar44;
        lVar21 = (ulong)auVar46._8_4_ * 0x60;
        auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar21),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1240 + lVar21) = auVar44;
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar21),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1230 + lVar21) = auVar44;
        set = (PrimInfoExtRange *)(lVar12 * 0x10);
        puVar20 = local_680 + lVar12 * 4;
        *puVar20 = *puVar20 + 1;
        piVar1 = (int *)((long)local_678 + (ulong)auVar46._4_4_ * 0x10 + -4);
        *piVar1 = *piVar1 + 1;
        *(int *)(local_678 + (ulong)auVar46._8_4_ * 2) =
             *(int *)(local_678 + (ulong)auVar46._8_4_ * 2) + 1;
        uVar18 = uVar18 + 2;
        paVar23 = paVar23 + 4;
      } while (uVar18 < uVar22 - 1);
    }
    if (uVar18 < uVar22) {
      aVar3 = pPVar9[uVar7 + uVar18].lower.field_0.field_1;
      aVar4 = pPVar9[uVar7 + uVar18].upper.field_0.field_1;
      auVar41._0_4_ = aVar3.x + aVar4.x;
      auVar41._4_4_ = aVar3.y + aVar4.y;
      auVar41._8_4_ = aVar3.z + aVar4.z;
      auVar41._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
      auVar41 = vsubps_avx(auVar41,local_12a0);
      auVar42._0_4_ = fVar26 * auVar41._0_4_;
      auVar42._4_4_ = fVar29 * auVar41._4_4_;
      auVar42._8_4_ = fVar30 * auVar41._8_4_;
      auVar42._12_4_ = fVar31 * auVar41._12_4_;
      auVar41 = vroundps_avx(auVar42,1);
      auVar41 = vcvtps2dq_avx(auVar41);
      auVar44 = vpshufd_avx(ZEXT416((int)local_12b0 - 1),0);
      auVar41 = vpminsd_avx(auVar41,auVar44);
      auVar39 = vpmaxsd_avx(auVar41,(undefined1  [16])0x0);
      uVar22 = (ulong)auVar39._0_4_;
      *(int *)(local_678 + uVar22 * 2 + -1) = *(int *)(local_678 + uVar22 * 2 + -1) + 1;
      auVar41 = *(undefined1 (*) [16])(local_1270 + uVar22 * 0x60);
      auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1280 + uVar22 * 0xc),(undefined1  [16])aVar3
                          );
      *(undefined1 (*) [16])(local_1280 + uVar22 * 0xc) = auVar44;
      auVar41 = vmaxps_avx(auVar41,(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1270 + uVar22 * 0x60) = auVar41;
      piVar1 = (int *)((long)local_678 + (ulong)auVar39._4_4_ * 0x10 + -4);
      *piVar1 = *piVar1 + 1;
      lVar12 = (ulong)auVar39._4_4_ * 0x60;
      auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar12),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1260 + lVar12) = auVar41;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar12),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1250 + lVar12) = auVar41;
      *(int *)(local_678 + (ulong)auVar39._8_4_ * 2) =
           *(int *)(local_678 + (ulong)auVar39._8_4_ * 2) + 1;
      lVar12 = (ulong)auVar39._8_4_ * 0x60;
      auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar12),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1240 + lVar12) = auVar41;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar12),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1230 + lVar12) = auVar41;
    }
  }
  local_12c0 = local_1290;
  lVar12 = local_12b0 - 1;
  if (lVar12 != 0) {
    lVar21 = local_12b0 * 0x10;
    pauVar19 = (undefined1 (*) [16])(local_1290 + local_12b0 * 0x60);
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    lVar24 = 0;
    auVar45 = auVar32;
    auVar39 = auVar32;
    auVar44 = auVar36;
    auVar41 = auVar36;
    do {
      auVar46 = vpaddd_avx(auVar40._0_16_,*(undefined1 (*) [16])(auStack_690 + lVar24 + lVar21));
      auVar40 = ZEXT1664(auVar46);
      auVar32 = vminps_avx(auVar32,pauVar19[-5]);
      auVar41 = vmaxps_avx(auVar41,pauVar19[-4]);
      *(undefined1 (*) [16])(auStack_490 + lVar24 + lVar21) = auVar46;
      auVar42 = vsubps_avx(auVar41,auVar32);
      auVar39 = vminps_avx(auVar39,pauVar19[-3]);
      auVar36 = vmaxps_avx(auVar36,pauVar19[-2]);
      auVar49 = vsubps_avx(auVar36,auVar39);
      auVar46 = vinsertps_avx(auVar49,auVar42,0x4c);
      auVar47 = vshufpd_avx(auVar42,auVar42,1);
      auVar47 = vinsertps_avx(auVar47,auVar49,0x9c);
      auVar42 = vunpcklps_avx(auVar42,auVar49);
      auVar49._0_4_ =
           auVar42._0_4_ * (auVar46._0_4_ + auVar47._0_4_) + auVar46._0_4_ * auVar47._0_4_;
      auVar49._4_4_ =
           auVar42._4_4_ * (auVar46._4_4_ + auVar47._4_4_) + auVar46._4_4_ * auVar47._4_4_;
      auVar49._8_4_ =
           auVar42._8_4_ * (auVar46._8_4_ + auVar47._8_4_) + auVar46._8_4_ * auVar47._8_4_;
      auVar49._12_4_ =
           auVar42._12_4_ * (auVar46._12_4_ + auVar47._12_4_) + auVar46._12_4_ * auVar47._12_4_;
      uVar2 = vmovlps_avx(auVar49);
      *(undefined8 *)((long)&uStack_290 + lVar24 + lVar21) = uVar2;
      auVar45 = vminps_avx(auVar45,pauVar19[-1]);
      auVar44 = vmaxps_avx(auVar44,*pauVar19);
      auVar42 = vsubps_avx(auVar44,auVar45);
      auVar46 = vmovshdup_avx(auVar42);
      auVar47 = vshufpd_avx(auVar42,auVar42,1);
      *(float *)((long)afStack_288 + lVar24 + lVar21) =
           auVar42._0_4_ * (auVar46._0_4_ + auVar47._0_4_) + auVar46._0_4_ * auVar47._0_4_;
      *(undefined4 *)((long)afStack_288 + lVar24 + lVar21 + 4) = 0;
      lVar24 = lVar24 + -0x10;
      pauVar19 = pauVar19 + -6;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  uVar22 = 0xffffffff;
  local_12d0._8_4_ = 0x7f800000;
  local_12d0._0_8_ = 0x7f8000007f800000;
  local_12d0._12_4_ = 0x7f800000;
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  auVar36 = (undefined1  [16])0x0;
  local_12e0 = (undefined1  [16])0x0;
  if (1 < uVar13) {
    auVar46 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
    pauVar19 = (undefined1 (*) [16])local_1230;
    auVar33._8_8_ = 0x100000001;
    auVar33._0_8_ = 0x100000001;
    auVar37._8_4_ = 0x7f800000;
    auVar37._0_8_ = 0x7f8000007f800000;
    auVar37._12_4_ = 0x7f800000;
    auVar43._8_4_ = 0xff800000;
    auVar43._0_8_ = 0xff800000ff800000;
    auVar43._12_4_ = 0xff800000;
    auVar45 = ZEXT816(0) << 0x40;
    lVar12 = 0;
    auVar32 = auVar43;
    auVar39 = auVar37;
    auVar41 = auVar43;
    local_12d0 = auVar37;
    auVar44 = auVar37;
    do {
      auVar44 = vminps_avx(auVar44,pauVar19[-5]);
      auVar43 = vmaxps_avx(auVar43,pauVar19[-4]);
      auVar39 = vminps_avx(auVar39,pauVar19[-3]);
      auVar32 = vmaxps_avx(auVar32,pauVar19[-2]);
      auVar42 = vsubps_avx(auVar43,auVar44);
      auVar11 = vsubps_avx(auVar32,auVar39);
      auVar37 = vminps_avx(auVar37,pauVar19[-1]);
      auVar41 = vmaxps_avx(auVar41,*pauVar19);
      auVar48 = vsubps_avx(auVar41,auVar37);
      auVar36 = vshufps_avx(auVar42,auVar48,0x65);
      auVar36 = vblendps_avx(auVar36,auVar11,2);
      auVar47 = vshufps_avx(auVar42,auVar48,0x96);
      auVar49 = vinsertps_avx(auVar47,auVar11,0x90);
      auVar47 = vshufps_avx(auVar42,auVar48,0);
      auVar45 = vpaddd_avx(auVar45,*(undefined1 (*) [16])((long)local_678 + lVar12 + -8));
      auVar11 = vinsertps_avx(auVar47,auVar11,0x10);
      auVar47 = vpaddd_avx(auVar45,auVar46);
      auVar47 = vpsrld_avx(auVar47,ZEXT416((uint)logBlockSize));
      auVar42 = vpaddd_avx(auVar46,*(undefined1 (*) [16])(auStack_470 + lVar12));
      auVar48 = vpsrad_avx(auVar47,0x1f);
      auVar10._8_8_ = 0x4f0000004f000000;
      auVar10._0_8_ = 0x4f0000004f000000;
      auVar48 = vpand_avx(auVar48,auVar10);
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar47 = vpand_avx(auVar47,auVar34);
      auVar47 = vcvtdq2ps_avx(auVar47);
      auVar42 = vpsrld_avx(auVar42,ZEXT416((uint)logBlockSize));
      auVar27 = vpsrad_avx(auVar42,0x1f);
      auVar10 = vpand_avx(auVar10,auVar27);
      auVar42 = vpand_avx(auVar42,auVar34);
      auVar42 = vcvtdq2ps_avx(auVar42);
      auVar27._0_4_ =
           ((auVar49._0_4_ + auVar36._0_4_) * auVar11._0_4_ + auVar49._0_4_ * auVar36._0_4_) *
           (auVar48._0_4_ + auVar47._0_4_) +
           (auVar42._0_4_ + auVar10._0_4_) * *(float *)((long)afStack_270 + lVar12);
      auVar27._4_4_ =
           ((auVar49._4_4_ + auVar36._4_4_) * auVar11._4_4_ + auVar49._4_4_ * auVar36._4_4_) *
           (auVar48._4_4_ + auVar47._4_4_) +
           (auVar42._4_4_ + auVar10._4_4_) * *(float *)((long)afStack_270 + lVar12 + 4);
      auVar27._8_4_ =
           ((auVar49._8_4_ + auVar36._8_4_) * auVar11._8_4_ + auVar49._8_4_ * auVar36._8_4_) *
           (auVar48._8_4_ + auVar47._8_4_) +
           (auVar42._8_4_ + auVar10._8_4_) * *(float *)((long)afStack_270 + lVar12 + 8);
      auVar27._12_4_ =
           ((auVar49._12_4_ + auVar36._12_4_) * auVar11._12_4_ + auVar49._12_4_ * auVar36._12_4_) *
           (auVar48._12_4_ + auVar47._12_4_) +
           (auVar42._12_4_ + auVar10._12_4_) * *(float *)((long)afStack_270 + lVar12 + 0xc);
      auVar36 = vcmpps_avx(auVar27,local_12d0,1);
      auVar36 = vblendvps_avx(auVar40._0_16_,auVar33,auVar36);
      auVar40 = ZEXT1664(auVar36);
      local_12d0 = vminps_avx(auVar27,local_12d0);
      auVar33 = vpsubd_avx(auVar33,_DAT_01febe20);
      pauVar19 = pauVar19 + 6;
      lVar12 = lVar12 + 0x10;
    } while (local_12b0 * 0x10 + -0x10 != lVar12);
  }
  local_12e0 = auVar36;
  fVar26 = INFINITY;
  uVar13 = 0;
  iVar14 = 0;
  local_12c0._0_8_ = local_1290._0_8_;
  local_12c0._8_8_ = local_1290._8_8_;
  do {
    if ((((*(float *)(local_1290 + uVar13 * 4) != 0.0) || (NAN(*(float *)(local_1290 + uVar13 * 4)))
         ) && (*(float *)(local_12d0 + uVar13 * 4) < fVar26)) &&
       (*(int *)(local_12e0 + uVar13 * 4) != 0)) {
      uVar22 = uVar13 & 0xffffffff;
      iVar14 = *(int *)(local_12e0 + uVar13 * 4);
      fVar26 = *(float *)(local_12d0 + uVar13 * 4);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  __return_storage_ptr__->sah = fVar26;
  iVar16 = (int)uVar22;
  __return_storage_ptr__->dim = iVar16;
  (__return_storage_ptr__->field_2).pos = iVar14;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_12b0;
  local_1330 = local_12a0._0_8_;
  uStack_1328 = local_12a0._8_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_1330;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uStack_1328;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_12c0._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_12c0._8_8_;
  if (iVar16 == -1) {
    info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
    info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
    aVar25.m128[2] = INFINITY;
    aVar25._0_8_ = 0x7f8000007f800000;
    aVar25.m128[3] = INFINITY;
    (info->leftBounds).lower.field_0 = aVar25;
    aVar35.m128[2] = -INFINITY;
    aVar35._0_8_ = 0xff800000ff800000;
    aVar35.m128[3] = -INFINITY;
    aVar28 = aVar35;
  }
  else {
    uVar13 = (ulong)iVar14;
    aVar28.m128[2] = -INFINITY;
    aVar28._0_8_ = 0xff800000ff800000;
    aVar28.m128[3] = -INFINITY;
    aVar25.m128[2] = INFINITY;
    aVar25._0_8_ = 0x7f8000007f800000;
    aVar25.m128[3] = INFINITY;
    lVar12 = (long)iVar16;
    if (iVar14 == 0) {
      sVar15 = 0;
      aVar38 = aVar25;
      aVar35 = aVar28;
    }
    else {
      puVar20 = (uint *)((long)local_678 + lVar12 * 4 + -8);
      pauVar19 = (undefined1 (*) [16])(local_1270 + lVar12 * 0x20);
      aVar38.m128[2] = INFINITY;
      aVar38._0_8_ = 0x7f8000007f800000;
      aVar38.m128[3] = INFINITY;
      aVar35.m128[2] = -INFINITY;
      aVar35._0_8_ = 0xff800000ff800000;
      aVar35.m128[3] = -INFINITY;
      sVar15 = 0;
      uVar22 = uVar13;
      do {
        aVar38.m128 = (__m128)vminps_avx(aVar38.m128,pauVar19[-1]);
        aVar35.m128 = (__m128)vmaxps_avx(aVar35.m128,*pauVar19);
        sVar15 = sVar15 + *puVar20;
        puVar20 = puVar20 + 4;
        pauVar19 = pauVar19 + 6;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
    lVar21 = local_12b0 - uVar13;
    if (local_12b0 < uVar13 || lVar21 == 0) {
      sVar17 = 0;
    }
    else {
      puVar20 = (uint *)((long)local_678 + uVar13 * 0x10 + lVar12 * 4 + -8);
      pauVar19 = (undefined1 (*) [16])(local_1270 + lVar12 * 0x20 + uVar13 * 0x60);
      aVar25.m128[2] = INFINITY;
      aVar25._0_8_ = 0x7f8000007f800000;
      aVar25.m128[3] = INFINITY;
      aVar28.m128[2] = -INFINITY;
      aVar28._0_8_ = 0xff800000ff800000;
      aVar28.m128[3] = -INFINITY;
      sVar17 = 0;
      do {
        aVar25.m128 = (__m128)vminps_avx(aVar25.m128,pauVar19[-1]);
        aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,*pauVar19);
        sVar17 = sVar17 + *puVar20;
        puVar20 = puVar20 + 4;
        pauVar19 = pauVar19 + 6;
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    info->leftCount = sVar15;
    info->rightCount = sVar17;
    (info->leftBounds).lower.field_0 = aVar38;
  }
  (info->leftBounds).upper.field_0 = aVar35;
  (info->rightBounds).lower.field_0 = aVar25;
  (info->rightBounds).upper.field_0 = aVar28;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }